

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O1

int green_future_cancel(green_future_t future)

{
  if (future == (green_future_t)0x0) {
    return 1;
  }
  if (0 < future->refs) {
    if (future->state != green_future_pending) {
      return 8;
    }
    future->state = green_future_aborted;
    return 0;
  }
  green_future_cancel_cold_1();
  halt_baddata();
}

Assistant:

int green_future_cancel(green_future_t future)
{
    // NOTE: when the async operation completes, the attempt to resolve the
    //       future will may omit to post a completion notification if it is
    //       possible to do so.  However, it's also possible that the
    //       completion notification is already in flight.  In that case, the
    //       coroutine that wakes up should also avoid to return control to
    //       application code as a result of the completion notification for a
    //       canceled future.
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future->refs > 0);
    if (future->state != green_future_pending) {
        return GREEN_EBADFD;
    }
    future->state = green_future_aborted;
    return GREEN_SUCCESS;
}